

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

size_t fctkern__tst_cnt(fctkern_t *nk)

{
  fct_nlist_t *list;
  size_t sVar1;
  long in_RDI;
  fct_ts_t *ts;
  size_t num_itemsts;
  size_t item_its;
  size_t tally;
  void *in_stack_ffffffffffffffd8;
  fct_nlist_t *local_18;
  size_t local_10;
  
  local_10 = 0;
  if (in_RDI == 0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x8dc,"size_t fctkern__tst_cnt(const fctkern_t *)");
  }
  if (in_RDI != -0x1d8) {
    list = (fct_nlist_t *)fct_nlist__size((fct_nlist_t *)0x103c1d);
    for (local_18 = (fct_nlist_t *)0x0; local_18 != list;
        local_18 = (fct_nlist_t *)((long)&local_18->itm_list + 1)) {
      in_stack_ffffffffffffffd8 = fct_nlist__at(list,(size_t)in_stack_ffffffffffffffd8);
      sVar1 = fct_ts__tst_cnt((fct_ts_t *)0x103c5a);
      local_10 = sVar1 + local_10;
    }
  }
  return local_10;
}

Assistant:

static size_t
fctkern__tst_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );
    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__tst_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}